

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,ByteArray *aBuf)

{
  OptionType aOptionNumber;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  bool bVar1;
  Error *pEVar2;
  reference ppVar3;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  const_iterator local_198;
  ErrorCode local_18c;
  Error local_188;
  int local_160;
  ErrorCode local_15c;
  OptionValue local_158;
  Error local_140;
  reference local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  iterator __end4;
  iterator __begin4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string local_f0;
  Error local_d0;
  undefined1 local_a8 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriPathSegments;
  OptionValue *value;
  OptionType *number;
  pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue> *option;
  const_iterator __end2;
  const_iterator __begin2;
  map<ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  *__range2;
  Error local_50;
  type local_24;
  byte local_21;
  uint16_t lastOptionNumber;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvStack_20;
  ByteArray *aBuf_local;
  Message *this_local;
  Error *error;
  
  local_21 = 0;
  pvStack_20 = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  aBuf_local = (ByteArray *)this;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  Serialize(&local_50,this,&this->mHeader,(ByteArray *)pvStack_20);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_50);
  __range2._0_4_ = 0;
  bVar1 = commissioner::operator!=(pEVar2,(ErrorCode *)&__range2);
  Error::~Error(&local_50);
  if (!bVar1) {
    local_24 = 0;
    __end2 = std::
             map<ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
             ::begin(&this->mOptions);
    option = (pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue> *)
             std::
             map<ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
             ::end(&this->mOptions);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&option), bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>
               ::operator*(&__end2);
      uriPathSegments.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = (size_t)&ppVar3->second;
      if (ppVar3->first == kUriPath) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
        OptionValue::GetStringValue_abi_cxx11_
                  (&local_f0,
                   (OptionValue *)
                   uriPathSegments.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size);
        SplitUriPath(&local_d0,
                     (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8,&local_f0);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_d0);
        __range4._4_4_ = 0;
        bVar1 = commissioner::operator!=(pEVar2,(ErrorCode *)((long)&__range4 + 4));
        Error::~Error(&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        if (bVar1) {
          local_160 = 4;
        }
        else {
          __end4 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a8);
          segment = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::__cxx11::
                    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8);
          while (bVar1 = std::operator!=(&__end4,(_Self *)&segment), bVar1) {
            local_118 = std::
                        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&__end4);
            aOptionNumber = ppVar3->first;
            OptionValue::OptionValue(&local_158,local_118);
            Serialize(&local_140,this,aOptionNumber,&local_158,local_24,(ByteArray *)pvStack_20);
            pEVar2 = Error::operator=(__return_storage_ptr__,&local_140);
            local_15c = kNone;
            bVar1 = commissioner::operator!=(pEVar2,&local_15c);
            Error::~Error(&local_140);
            OptionValue::~OptionValue(&local_158);
            if (bVar1) {
              local_160 = 4;
              goto LAB_0018cd8c;
            }
            local_24 = utils::to_underlying<ot::commissioner::coap::OptionType>(ppVar3->first);
            std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end4);
          }
          local_160 = 0;
        }
LAB_0018cd8c:
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
        if (local_160 != 0) {
          if (local_160 != 4) goto LAB_0018cf61;
          goto LAB_0018cf53;
        }
      }
      else {
        Serialize(&local_188,this,ppVar3->first,
                  (OptionValue *)
                  uriPathSegments.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size,local_24,(ByteArray *)pvStack_20);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_188);
        local_18c = kNone;
        bVar1 = commissioner::operator!=(pEVar2,&local_18c);
        Error::~Error(&local_188);
        if (bVar1) goto LAB_0018cf53;
        local_24 = utils::to_underlying<ot::commissioner::coap::OptionType>(ppVar3->first);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>
      ::operator++(&__end2);
    }
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mPayload);
    if (!bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvStack_20,&kPayloadMarker
                );
      this_00 = pvStack_20;
      local_1a0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvStack_20);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_198,&local_1a0);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mPayload);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->mPayload);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (this_00,local_198,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
    }
  }
LAB_0018cf53:
  local_21 = 1;
  local_160 = 1;
LAB_0018cf61:
  if ((local_21 & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(ByteArray &aBuf) const
{
    Error    error;
    uint16_t lastOptionNumber;

    SuccessOrExit(error = Serialize(mHeader, aBuf));

    lastOptionNumber = 0;
    for (const auto &option : mOptions)
    {
        const auto &number = option.first;
        const auto &value  = option.second;
        if (number == OptionType::kUriPath)
        {
            std::list<std::string> uriPathSegments;
            SuccessOrExit(error = SplitUriPath(uriPathSegments, value.GetStringValue()));
            for (const auto &segment : uriPathSegments)
            {
                SuccessOrExit(error = Serialize(number, OptionValue{segment}, lastOptionNumber, aBuf));
                lastOptionNumber = utils::to_underlying(number);
            }
        }
        else
        {
            SuccessOrExit(error = Serialize(number, value, lastOptionNumber, aBuf));
            lastOptionNumber = utils::to_underlying(number);
        }
    }

    if (!mPayload.empty())
    {
        aBuf.push_back(kPayloadMarker);
        aBuf.insert(aBuf.end(), mPayload.begin(), mPayload.end());
    }

exit:
    return error;
}